

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

bool __thiscall crnlib::crn_comp::alias_images(crn_comp *this)

{
  color_quad<unsigned_char,_int> *p;
  undefined8 uVar1;
  level_details *plVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  conversion_type conv_type;
  crn_comp_params *pcVar5;
  color_quad<unsigned_char,_int> *pcVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  image<crnlib::color_quad<unsigned_char,_int>_> *other;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  pixel_buf_t *ppVar14;
  bool bVar15;
  bool bVar16;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_88;
  long local_80;
  pixel_buf_t *local_78;
  image<crnlib::color_quad<unsigned_char,_int>_> local_68;
  
  bVar15 = this->m_pParams->m_faces == 0;
  if (!bVar15) {
    local_78 = &this->m_images[0][0].m_pixel_buf;
    local_80 = 0x30;
    local_88 = (image<crnlib::color_quad<unsigned_char,_int>_> *)0x0;
    do {
      pcVar5 = this->m_pParams;
      bVar16 = pcVar5->m_levels != 0;
      if (bVar16) {
        pcVar6 = (color_quad<unsigned_char,_int> *)pcVar5->m_pImages[(long)local_88][0];
        if (pcVar6 != (color_quad<unsigned_char,_int> *)0x0) {
          uVar9 = pcVar5->m_height + (uint)(pcVar5->m_height == 0);
          uVar10 = pcVar5->m_width + (uint)(pcVar5->m_width == 0);
          uVar13 = 1;
          lVar7 = local_80;
          ppVar14 = local_78;
          do {
            if (ppVar14->m_p != (color_quad<unsigned_char,_int> *)0x0) {
              crnlib_free(ppVar14->m_p);
              ppVar14->m_p = (color_quad<unsigned_char,_int> *)0x0;
              ppVar14->m_size = 0;
              ppVar14->m_capacity = 0;
            }
            *(color_quad<unsigned_char,_int> **)((long)(ppVar14 + -1) + 8) = pcVar6;
            ((image_u8 *)(ppVar14 + -2))->m_width = uVar10;
            ((image_u8 *)(ppVar14 + -2))->m_height = uVar9;
            ((image_u8 *)(ppVar14 + -2))->m_pitch = uVar10;
            ((image_u8 *)(ppVar14 + -2))->m_total = uVar9 * uVar10;
            *(uint *)(ppVar14 + -1) = 0xf;
            pcVar5 = this->m_pParams;
            bVar16 = uVar13 < pcVar5->m_levels;
            if (!bVar16) goto LAB_0017132d;
            uVar11 = pcVar5->m_width >> ((byte)uVar13 & 0x1f);
            uVar10 = uVar11 + (uVar11 == 0);
            uVar11 = pcVar5->m_height >> ((byte)uVar13 & 0x1f);
            uVar9 = uVar11 + (uVar11 == 0);
            pcVar6 = *(color_quad<unsigned_char,_int> **)
                      ((long)(pcVar5->m_pImages + -1) + 0x58 + lVar7);
            ppVar14 = ppVar14 + 3;
            uVar13 = uVar13 + 1;
            lVar7 = lVar7 + 8;
          } while (pcVar6 != (color_quad<unsigned_char,_int> *)0x0);
        }
        if (bVar16) {
          if (bVar15 == false) {
            return false;
          }
          break;
        }
      }
LAB_0017132d:
      local_88 = (image<crnlib::color_quad<unsigned_char,_int>_> *)((long)local_88 + 1);
      local_78 = local_78 + 0x30;
      local_80 = local_80 + 0x80;
      bVar16 = local_88 < (ulong)this->m_pParams->m_faces;
      bVar15 = !bVar16;
    } while (bVar16);
  }
  conv_type = image_utils::get_image_conversion_type_from_crn_format(this->m_pParams->m_format);
  if ((conv_type != cConversion_Invalid) && (this->m_pParams->m_faces != 0)) {
    local_88 = this->m_images[0];
    uVar8 = 0;
    do {
      if (this->m_pParams->m_levels != 0) {
        uVar12 = 0;
        other = local_88;
        do {
          image<crnlib::color_quad<unsigned_char,_int>_>::image(&local_68,other);
          image_utils::convert_image(&local_68,conv_type);
          uVar3._0_4_ = other->m_width;
          uVar3._4_4_ = other->m_height;
          uVar4._0_4_ = other->m_pitch;
          uVar4._4_4_ = other->m_total;
          other->m_width = local_68.m_width;
          other->m_height = local_68.m_height;
          other->m_pitch = local_68.m_pitch;
          other->m_total = local_68.m_total;
          uVar9 = other->m_comp_flags;
          other->m_comp_flags = local_68.m_comp_flags;
          pcVar6 = other->m_pPixels;
          p = (other->m_pixel_buf).m_p;
          other->m_pPixels = local_68.m_pPixels;
          (other->m_pixel_buf).m_p = local_68.m_pixel_buf.m_p;
          uVar1._0_4_ = (other->m_pixel_buf).m_size;
          uVar1._4_4_ = (other->m_pixel_buf).m_capacity;
          (other->m_pixel_buf).m_size = local_68.m_pixel_buf.m_size;
          (other->m_pixel_buf).m_capacity = local_68.m_pixel_buf.m_capacity;
          local_68._0_8_ = uVar3;
          local_68._8_8_ = uVar4;
          local_68.m_comp_flags = uVar9;
          local_68.m_pPixels = pcVar6;
          local_68.m_pixel_buf.m_p = p;
          local_68.m_pixel_buf._8_8_ = uVar1;
          if (p != (color_quad<unsigned_char,_int> *)0x0) {
            crnlib_free(p);
          }
          uVar12 = uVar12 + 1;
          other = other + 1;
        } while (uVar12 < this->m_pParams->m_levels);
      }
      uVar8 = uVar8 + 1;
      local_88 = local_88 + 0x10;
    } while (uVar8 < this->m_pParams->m_faces);
  }
  uVar13 = this->m_pParams->m_levels;
  uVar11 = (this->m_levels).m_size;
  if (uVar11 != uVar13) {
    if ((uVar11 <= uVar13) && ((this->m_levels).m_capacity < uVar13)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_levels,uVar13,uVar11 + 1 == uVar13,0xc,
                 (object_mover)0x0,false);
    }
    (this->m_levels).m_size = uVar13;
  }
  this->m_total_blocks = 0;
  pcVar5 = this->m_pParams;
  if (pcVar5->m_levels != 0) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      uVar13 = pcVar5->m_height >> ((byte)uVar8 & 0x1f);
      uVar11 = pcVar5->m_width >> ((byte)uVar8 & 0x1f);
      *(uint *)((long)&((this->m_levels).m_p)->block_width + lVar7) =
           (uVar11 + 7 + (uint)(uVar11 == 0) & 0xfffffff8) >> (2U - this->m_has_subblocks & 0x1f);
      *(uint *)((long)&((this->m_levels).m_p)->first_block + lVar7) = this->m_total_blocks;
      plVar2 = (this->m_levels).m_p;
      *(uint *)((long)&plVar2->num_blocks + lVar7) =
           (uVar13 + 7 + (uint)(uVar13 == 0) >> 2 & 0xfffffffe) * this->m_pParams->m_faces *
           *(int *)((long)&plVar2->block_width + lVar7);
      this->m_total_blocks =
           this->m_total_blocks + *(int *)((long)&((this->m_levels).m_p)->num_blocks + lVar7);
      uVar8 = uVar8 + 1;
      pcVar5 = this->m_pParams;
      lVar7 = lVar7 + 0xc;
    } while (uVar8 < pcVar5->m_levels);
  }
  return bVar15;
}

Assistant:

bool crn_comp::alias_images() {
  for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
    for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
      const uint width = math::maximum(1U, m_pParams->m_width >> level_index);
      const uint height = math::maximum(1U, m_pParams->m_height >> level_index);
      if (!m_pParams->m_pImages[face_index][level_index])
        return false;
      m_images[face_index][level_index].alias((color_quad_u8*)m_pParams->m_pImages[face_index][level_index], width, height);
    }
  }

  image_utils::conversion_type conv_type = image_utils::get_image_conversion_type_from_crn_format((crn_format)m_pParams->m_format);
  if (conv_type != image_utils::cConversion_Invalid) {
    for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
      for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
        image_u8 cooked_image(m_images[face_index][level_index]);
        image_utils::convert_image(cooked_image, conv_type);
        m_images[face_index][level_index].swap(cooked_image);
      }
    }
  }

  m_levels.resize(m_pParams->m_levels);
  m_total_blocks = 0;
  for (uint level = 0; level < m_pParams->m_levels; level++) {
    uint blockHeight = ((math::maximum(1U, m_pParams->m_height >> level) + 7) & ~7) >> 2;
    m_levels[level].block_width = ((math::maximum(1U, m_pParams->m_width >> level) + 7) & ~7) >> (m_has_subblocks ? 1 : 2);
    m_levels[level].first_block = m_total_blocks;
    m_levels[level].num_blocks = m_pParams->m_faces * m_levels[level].block_width * blockHeight;
    m_total_blocks += m_levels[level].num_blocks;
  }

  return true;
}